

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst.h
# Opt level: O1

shared_ptr<mocker::nasm::Register> __thiscall
mocker::nasm::dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>&>
          (nasm *this,shared_ptr<mocker::nasm::Addr> *v)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  undefined1 auVar4 [16];
  shared_ptr<mocker::nasm::Register> sVar5;
  
  peVar1 = (v->super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    lVar3 = 0;
  }
  else {
    auVar4 = __dynamic_cast(peVar1,&Addr::typeinfo,&Register::typeinfo,0);
    in_RDX._M_pi = auVar4._8_8_;
    lVar3 = auVar4._0_8_;
  }
  if (lVar3 == 0) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    *(long *)this = lVar3;
    p_Var2 = (v->super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var2;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
  }
  sVar5.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar5.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::nasm::Register>)
         sVar5.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> dyc(V &&v) {
  return std::dynamic_pointer_cast<T>(v);
}